

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutInfo::item(QDockAreaLayoutInfo *this,QList<int> *path)

{
  int iVar1;
  ulong uVar2;
  QDockAreaLayoutInfo *this_00;
  pointer pQVar3;
  QDockAreaLayoutItem *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (path->d).size;
  iVar1 = *(path->d).ptr;
  pQVar3 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  if (uVar2 < 2) {
    pQVar4 = pQVar3 + iVar1;
  }
  else {
    this_00 = pQVar3[iVar1].subinfo;
    QList<int>::mid((QList<int> *)&local_40,path,1,-1);
    pQVar4 = item(this_00,(QList<int> *)&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutItem &QDockAreaLayoutInfo::item(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->item(path.mid(1));
    }
    return item_list[index];
}